

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

UBool __thiscall icu_63::VTimeZone::operator==(VTimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  
  UVar2 = '\x01';
  if (this != (VTimeZone *)that) {
    bVar1 = std::type_info::operator!=
                      ((type_info *)
                       (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if ((((!bVar1) && (UVar2 = TimeZone::operator==((TimeZone *)this,that), UVar2 != '\0')) &&
        (iVar3 = (*(this->tz->super_TimeZone).super_UObject._vptr_UObject[3])
                           (this->tz,that[1].super_UObject._vptr_UObject), (char)iVar3 != '\0')) &&
       (UVar2 = UnicodeString::operator==
                          (&this->tzurl,(UnicodeString *)&that[1].fID.fUnion.fStackFields),
       UVar2 != '\0')) {
      if ((this->lastmod == (double)that[2].fID.super_Replaceable.super_UObject._vptr_UObject) &&
         (!NAN(this->lastmod) &&
          !NAN((double)that[2].fID.super_Replaceable.super_UObject._vptr_UObject))) {
        return '\x01';
      }
    }
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

UBool
VTimeZone::operator==(const TimeZone& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that) || !BasicTimeZone::operator==(that)) {
        return FALSE;
    }
    VTimeZone *vtz = (VTimeZone*)&that;
    if (*tz == *(vtz->tz)
        && tzurl == vtz->tzurl
        && lastmod == vtz->lastmod
        /* && olsonzid = that.olsonzid */
        /* && icutzver = that.icutzver */) {
        return TRUE;
    }
    return FALSE;
}